

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O3

void rv64gcsu_priv1_10_0_cpu_init(CPUState_conflict *obj)

{
  obj[1].tb_jmp_cache[0x18a] = (TranslationBlock_conflict *)0x800000000014112d;
  obj[1].tb_jmp_cache[0x18b] = (TranslationBlock_conflict *)0x800000000014112d;
  obj[1].tb_jmp_cache[0x189] = (TranslationBlock_conflict *)0x11000;
  obj[1].tb_jmp_cache[399] = (TranslationBlock_conflict *)0x1000;
  *(byte *)(obj[1].tb_jmp_cache + 0x18c) = *(byte *)(obj[1].tb_jmp_cache + 0x18c) | 3;
  return;
}

Assistant:

static void rv64gcsu_priv1_10_0_cpu_init(CPUState *obj)
{
    CPURISCVState *env = &RISCV_CPU(obj)->env;
    set_misa(env, RV64 | RVI | RVM | RVA | RVF | RVD | RVC | RVS | RVU);
    set_priv_version(env, PRIV_VERSION_1_10_0);
    set_resetvec(env, DEFAULT_RSTVEC);
    set_feature(env, RISCV_FEATURE_MMU);
    set_feature(env, RISCV_FEATURE_PMP);
}